

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

void __thiscall
helics::CommonCore::sendTo
          (CommonCore *this,InterfaceHandle sourceHandle,void *data,uint64_t length,
          string_view destination)

{
  atomic<int> *paVar1;
  size_t sVar2;
  BrokerObject *pBVar3;
  BrokerObject *pBVar4;
  string_view string3;
  void *pvVar5;
  void *pvVar6;
  int iVar7;
  unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_> *puVar8;
  FederateState *this_00;
  void *pvVar9;
  InvalidIdentifier *this_01;
  HelicsException *this_02;
  char *pcVar10;
  size_t sVar11;
  size_t sVar12;
  long lVar13;
  void *pvVar14;
  string_view message_00;
  string_view message_01;
  string_view string2;
  byte *st1;
  ActionMessage message;
  undefined1 local_e8 [26];
  uint16_t local_ce;
  Time local_c8;
  SmallBuffer local_a8;
  
  pcVar10 = destination._M_str;
  sVar12 = destination._M_len;
  if (sVar12 == 0) {
    send(this,sourceHandle.hid,data,length,(int)destination._M_len);
    return;
  }
  puVar8 = getHandleInfo(this,sourceHandle);
  if (puVar8 == (unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_> *)0x0)
  {
    this_01 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    pcVar10 = "handle is not valid";
    sVar11 = 0x13;
LAB_0030dd6e:
    message_00._M_str = pcVar10;
    message_00._M_len = sVar11;
    InvalidIdentifier::InvalidIdentifier(this_01,message_00);
    __cxa_throw(this_01,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
  }
  if (*(char *)((long)&puVar8[1]._M_t.
                       super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
                       .super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl + 4) !=
      'e') {
    this_01 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    pcVar10 = "handle does not point to an endpoint";
    sVar11 = 0x24;
    goto LAB_0030dd6e;
  }
  this_00 = getFederateAt(this,(LocalFederateId)
                               *(BaseType *)
                                &puVar8[1]._M_t.
                                 super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
                                 .super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl)
  ;
  if (((ulong)puVar8[1]._M_t.
              super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
              ._M_t.
              super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
              .super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl & 0x400000000000000
      ) == 0) goto LAB_0030dc4d;
  FederateState::getMessageDestinations
            ((vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
              *)local_e8,this_00,sourceHandle);
  pvVar5 = (void *)CONCAT44(local_e8._4_4_,local_e8._0_4_);
  pvVar6 = (void *)CONCAT44(local_e8._12_4_,local_e8._8_4_);
  lVar13 = ((long)pvVar6 - (long)pvVar5 >> 3) * -0x5555555555555555 >> 2;
  pvVar9 = pvVar5;
  if (0 < lVar13) {
    pvVar9 = (void *)(lVar13 * 0x60 + (long)pvVar5);
    lVar13 = lVar13 + 1;
    pvVar14 = (void *)((long)pvVar5 + 0x30);
    do {
      sVar2 = *(size_t *)((long)pvVar14 + -0x28);
      if ((sVar2 == sVar12) &&
         ((sVar2 == 0 || (iVar7 = bcmp(*(void **)((long)pvVar14 + -0x20),pcVar10,sVar2), iVar7 == 0)
          ))) {
        pvVar14 = (void *)((long)pvVar14 + -0x30);
        goto LAB_0030dc2b;
      }
      sVar2 = *(size_t *)((long)pvVar14 + -0x10);
      if ((sVar2 == sVar12) &&
         ((sVar2 == 0 || (iVar7 = bcmp(*(void **)((long)pvVar14 + -8),pcVar10,sVar2), iVar7 == 0))))
      {
        pvVar14 = (void *)((long)pvVar14 + -0x18);
        goto LAB_0030dc2b;
      }
      sVar2 = *(size_t *)((long)pvVar14 + 8);
      if ((sVar2 == sVar12) &&
         ((sVar2 == 0 || (iVar7 = bcmp(*(void **)((long)pvVar14 + 0x10),pcVar10,sVar2), iVar7 == 0))
         )) goto LAB_0030dc2b;
      sVar2 = *(size_t *)((long)pvVar14 + 0x20);
      if ((sVar2 == sVar12) &&
         ((sVar2 == 0 || (iVar7 = bcmp(*(void **)((long)pvVar14 + 0x28),pcVar10,sVar2), iVar7 == 0))
         )) {
        pvVar14 = (void *)((long)pvVar14 + 0x18);
        goto LAB_0030dc2b;
      }
      lVar13 = lVar13 + -1;
      pvVar14 = (void *)((long)pvVar14 + 0x60);
    } while (1 < lVar13);
  }
  lVar13 = ((long)pvVar6 - (long)pvVar9 >> 3) * -0x5555555555555555;
  if (lVar13 == 1) {
LAB_0030dbf2:
    sVar2 = *(size_t *)((long)pvVar9 + 8);
    pvVar14 = pvVar6;
    if (((sVar2 == sVar12) && (pvVar14 = pvVar9, sVar2 != 0)) &&
       (iVar7 = bcmp(*(void **)((long)pvVar9 + 0x10),pcVar10,sVar2), iVar7 != 0)) {
      pvVar14 = pvVar6;
    }
  }
  else if (lVar13 == 2) {
LAB_0030db88:
    sVar2 = *(size_t *)((long)pvVar9 + 8);
    if ((sVar2 != sVar12) ||
       ((pvVar14 = pvVar9, sVar2 != 0 &&
        (iVar7 = bcmp(*(void **)((long)pvVar9 + 0x10),pcVar10,sVar2), iVar7 != 0)))) {
      pvVar9 = (void *)((long)pvVar9 + 0x18);
      goto LAB_0030dbf2;
    }
  }
  else {
    pvVar14 = pvVar6;
    if ((lVar13 == 3) &&
       ((sVar2 = *(size_t *)((long)pvVar9 + 8), sVar2 != sVar12 ||
        ((pvVar14 = pvVar9, sVar2 != 0 &&
         (iVar7 = bcmp(*(void **)((long)pvVar9 + 0x10),pcVar10,sVar2), iVar7 != 0)))))) {
      pvVar9 = (void *)((long)pvVar9 + 0x18);
      goto LAB_0030db88;
    }
  }
LAB_0030dc2b:
  if (pvVar14 == pvVar6) {
    this_02 = (HelicsException *)__cxa_allocate_exception(0x28);
    message_01._M_str = "targeted endpoint destination not in target list";
    message_01._M_len = 0x30;
    HelicsException::HelicsException(this_02,message_01);
    *(undefined ***)this_02 = &PTR__HelicsException_005518c0;
    __cxa_throw(this_02,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
  }
  if (pvVar5 != (void *)0x0) {
    operator_delete(pvVar5,local_e8._16_8_ - (long)pvVar5);
  }
LAB_0030dc4d:
  ActionMessage::ActionMessage((ActionMessage *)local_e8,cmd_send_message);
  LOCK();
  paVar1 = &this->messageCounter;
  local_e8._4_4_ = (paVar1->super___atomic_base<int>)._M_i;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  local_e8._4_4_ = local_e8._4_4_ + 1;
  local_e8._8_4_ =
       *(undefined4 *)
        &(puVar8->_M_t).
         super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>.
         _M_t.
         super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>.
         super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl;
  local_ce = *(uint16_t *)
              ((long)&puVar8[1]._M_t.
                      super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
                      .super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl + 6);
  local_e8._12_4_ = sourceHandle.hid;
  SmallBuffer::reserve(&local_a8,length);
  local_a8.bufferSize = length;
  memcpy(local_a8.heap,data,length);
  pBVar3 = puVar8[2]._M_t.
           super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>.
           _M_t.
           super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
           .super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl;
  pBVar4 = puVar8[3]._M_t.
           super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>.
           _M_t.
           super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
           .super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl;
  string3._M_str = (char *)pBVar3;
  string3._M_len = (size_t)pBVar4;
  string2._M_str = (char *)pBVar3;
  string2._M_len = (size_t)pBVar4;
  ActionMessage::setStringData((ActionMessage *)local_e8,destination,string2,string3);
  local_c8.internalTimeCode = (this_00->allowed_send_time).internalTimeCode;
  BrokerBase::addActionMessage(&this->super_BrokerBase,(ActionMessage *)local_e8);
  ActionMessage::~ActionMessage((ActionMessage *)local_e8);
  return;
}

Assistant:

void CommonCore::sendTo(InterfaceHandle sourceHandle,
                        const void* data,
                        uint64_t length,
                        std::string_view destination)
{
    if (destination.empty()) {
        // sendTo should be the equivalent of send if there is an empty destination
        send(sourceHandle, data, length);
        return;
    }
    const auto* hndl = getHandleInfo(sourceHandle);
    if (hndl == nullptr) {
        throw(InvalidIdentifier("handle is not valid"));
    }

    if (hndl->handleType != InterfaceType::ENDPOINT) {
        throw(InvalidIdentifier("handle does not point to an endpoint"));
    }
    auto* fed = getFederateAt(hndl->local_fed_id);
    if (checkActionFlag(*hndl, targeted_flag)) {
        auto targets = fed->getMessageDestinations(sourceHandle);
        auto res = std::find_if(targets.begin(), targets.end(), [destination](const auto& val) {
            return (val.second == destination);
        });
        if (res == targets.end()) {
            throw(InvalidParameter("targeted endpoint destination not in target list"));
        }
    }
    ActionMessage message(CMD_SEND_MESSAGE);

    message.messageID = ++messageCounter;
    message.source_handle = sourceHandle;
    message.source_id = hndl->getFederateId();
    message.flags = hndl->flags;
    message.payload.assign(data, length);
    message.setStringData(destination, hndl->key, hndl->key);
    message.actionTime = fed->nextAllowedSendTime();
    addActionMessage(std::move(message));
}